

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

bool __thiscall FIX::DataDictionary::isMsgField(DataDictionary *this,string *msgType,int field)

{
  const_iterator cVar1;
  _Base_ptr *pp_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  *)(this + 0x68),msgType);
  if (cVar1._M_node == (_Base_ptr)(this + 0x70)) {
    bVar6 = false;
  }
  else {
    p_Var4 = cVar1._M_node[2]._M_left;
    pp_Var2 = &cVar1._M_node[2]._M_parent;
    p_Var3 = (_Base_ptr)pp_Var2;
    p_Var5 = (_Base_ptr)pp_Var2;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        if (field <= (int)p_Var4[1]._M_color) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < field];
      } while (p_Var4 != (_Base_ptr)0x0);
      if ((p_Var3 != (_Base_ptr)pp_Var2) && (p_Var5 = p_Var3, field < (int)p_Var3[1]._M_color)) {
        p_Var5 = (_Base_ptr)pp_Var2;
      }
    }
    bVar6 = p_Var5 != (_Base_ptr)pp_Var2;
  }
  return bVar6;
}

Assistant:

bool isMsgField(const std::string &msgType, int field) const {
    MsgTypeToField::const_iterator i = m_messageFields.find(msgType);
    if (i == m_messageFields.end()) {
      return false;
    }
    return i->second.find(field) != i->second.end();
  }